

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator::
findNextLeaf(FastInstancesIterator *this)

{
  InstMatcher *this_00;
  void **ppvVar1;
  Node *pNVar2;
  int *piVar3;
  NodeAlgorithm **ppNVar4;
  uint **ppuVar5;
  void ***pppvVar6;
  void **ppvVar7;
  void **ppvVar8;
  undefined8 *puVar9;
  bool bVar10;
  bool separate;
  byte bVar11;
  int iVar12;
  uint *puVar13;
  undefined8 extraout_RAX;
  Node *alts;
  TermList queryTerm;
  undefined8 *puVar14;
  uint uVar15;
  uint uVar16;
  Node *curr;
  Node *local_60;
  undefined4 local_54;
  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *local_50;
  LDIterator *local_48;
  Stack<void_*> *local_40;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor == (this->_alternatives)._stack) {
LAB_0033f658:
      bVar11 = 0;
      goto LAB_0033f65a;
    }
    SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
              (&this->_subst);
    this->_inLeaf = false;
    local_60 = (Node *)0x0;
    separate = false;
  }
  else {
    local_60 = this->_root;
    if (local_60 == (Node *)0x0) goto LAB_0033f658;
    this->_root = (Node *)0x0;
    separate = enterNode(this,&local_60);
  }
  local_40 = &this->_alternatives;
  this_00 = &this->_subst;
  local_48 = &this->_ldIterator;
  local_50 = &(this->_subst)._derefBindings;
  local_54 = SUB84(local_50,0);
  do {
    if (local_60 == (Node *)0x0) {
      uVar15 = 0;
    }
    else {
      if (separate == false) {
        puVar13 = (this->_specVarNumbers)._cursor + -1;
        (this->_specVarNumbers)._cursor = puVar13;
      }
      else {
        puVar13 = (this->_specVarNumbers)._cursor + -1;
      }
      uVar15 = *puVar13;
    }
    do {
      if (local_60 != (Node *)0x0) break;
      ppvVar7 = (this->_alternatives)._stack;
      ppvVar8 = (this->_alternatives)._cursor;
      if (ppvVar8 == ppvVar7) break;
      ppvVar1 = ppvVar8 + -1;
      (this->_alternatives)._cursor = ppvVar1;
      puVar9 = (undefined8 *)ppvVar8[-1];
      if (puVar9 == (undefined8 *)0x0) {
        ppNVar4 = &(this->_nodeTypes)._cursor;
        *ppNVar4 = *ppNVar4 + -1;
        ppuVar5 = &(this->_specVarNumbers)._cursor;
        *ppuVar5 = *ppuVar5 + -1;
        if (ppvVar1 != ppvVar7) {
          SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                    (this_00);
        }
      }
      else {
        if ((this->_nodeTypes)._cursor[-1] == UNSORTED_LIST) {
          local_60 = (Node *)*puVar9;
          if (puVar9[1] == 0) goto LAB_0033f482;
          puVar14 = puVar9 + 1;
LAB_0033f458:
          if (ppvVar1 == (this->_alternatives)._end) {
            ::Lib::Stack<void_*>::expand(local_40);
          }
          *(this->_alternatives)._cursor = puVar14;
          pppvVar6 = &(this->_alternatives)._cursor;
          *pppvVar6 = *pppvVar6 + 1;
          separate = true;
        }
        else {
          local_60 = (Node *)*puVar9;
          puVar14 = (undefined8 *)puVar9[1];
          if (puVar14 != (undefined8 *)0x0) goto LAB_0033f458;
LAB_0033f482:
          separate = false;
        }
        if (separate == false) {
          ppNVar4 = &(this->_nodeTypes)._cursor;
          *ppNVar4 = *ppNVar4 + -1;
          puVar13 = (this->_specVarNumbers)._cursor;
          (this->_specVarNumbers)._cursor = puVar13 + -1;
        }
        else {
          puVar13 = (this->_specVarNumbers)._cursor;
        }
        uVar15 = puVar13[-1];
      }
    } while (puVar9 == (undefined8 *)0x0);
    if (local_60 == (Node *)0x0) {
      local_54 = 0;
      uVar15 = 1;
    }
    else {
      bVar10 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::matchNext
                         (this_00,uVar15,(TermList)(local_60->_term)._content,separate);
      if (bVar10) {
        do {
          iVar12 = (*local_60->_vptr_Node[2])();
          if ((((char)iVar12 != '\0') || (iVar12 = (*local_60->_vptr_Node[5])(), iVar12 != 1)) ||
             (*(int *)((long)&local_60[1]._vptr_Node + 4) != 1)) {
            iVar12 = (*local_60->_vptr_Node[2])();
            if ((char)iVar12 == '\0') {
              separate = enterNode(this,&local_60);
              uVar16 = 0;
              uVar15 = 0;
              if (local_60 == (Node *)0x0) goto LAB_0033f625;
            }
            else {
              (*local_60->_vptr_Node[8])(&local_38);
              ::Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::operator=
                        (local_48,&local_38);
              if (local_38._core !=
                  (IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> *)0x0) {
                piVar3 = &(local_38._core)->_refCnt;
                *piVar3 = *piVar3 + -1;
                if (*piVar3 == 0) {
                  (*(local_38._core)->_vptr_IteratorCore[1])();
                }
              }
              this->_inLeaf = true;
              ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::reset(local_50);
              local_54 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              uVar15 = 1;
            }
            break;
          }
          pNVar2 = local_60 + 1;
          local_60 = (Node *)local_60[1]._term._content;
          queryTerm._content._4_4_ = 0;
          queryTerm._content._0_4_ = *(int *)&pNVar2->_vptr_Node * 4 + 3;
          uVar15 = 0;
          bVar10 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::
                   matchNextAux(this_00,queryTerm,(TermList)(local_60->_term)._content,false);
          if (!bVar10) {
            if ((separate != false) ||
               ((this->_alternatives)._cursor != (this->_alternatives)._stack)) {
              SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                        (this_00);
            }
            local_60 = (Node *)0x0;
            uVar15 = 4;
          }
        } while (bVar10);
      }
      else {
        local_60 = (Node *)0x0;
        uVar16 = 3;
        uVar15 = 3;
        if (separate == false) {
LAB_0033f625:
          uVar15 = uVar16;
          if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
          }
        }
      }
    }
  } while ((uVar15 < 5) && ((0x19U >> uVar15 & 1) != 0));
  bVar11 = (byte)local_54;
LAB_0033f65a:
  return (bool)(bVar11 & 1);
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
        ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
        currSpecVar = _specVarNumbers.top();
      } else {
	      currSpecVar = _specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
        //there's no alternative at this level, we have to backtrack
        _nodeTypes.pop();
        _specVarNumbers.pop();
        if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType = _nodeTypes.top();

      //the fact that we have alternatives means that here we are
      //matching by a variable (as there is always at most one child
      //for matching by term)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	curr=*(alts++);
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	ASS(alts);

	curr=alts->head();
	if(alts->tail()) {
	  _alternatives.push(alts->tail());
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      }

      if(sibilingsRemain) {
        currSpecVar = _specVarNumbers.top();
      } else {
        _nodeTypes.pop();
        currSpecVar = _specVarNumbers.pop();
      }
      ASS(curr);
      break;
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
	_subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst.backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      _subst.onLeafEntered(); //we reset the bindings cache
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}